

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream *
QtPrivate::readArrayBasedContainer<QList<std::pair<QByteArray,QByteArray>>>
          (QDataStream *s,QList<std::pair<QByteArray,_QByteArray>_> *c)

{
  long lVar1;
  Status SVar2;
  qint64 qVar3;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype n;
  qint64 size;
  value_type t;
  StreamStateSaver stateSaver;
  pair<QByteArray,_QByteArray> *in_stack_ffffffffffffff78;
  pair<QByteArray,_QByteArray> *in_stack_ffffffffffffff80;
  QDataStream *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  qsizetype asize;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  asize = -0x5555555555555556;
  StreamStateSaver::StreamStateSaver
            ((StreamStateSaver *)in_stack_ffffffffffffff80,(QDataStream *)in_stack_ffffffffffffff78)
  ;
  QList<std::pair<QByteArray,_QByteArray>_>::clear
            ((QList<std::pair<QByteArray,_QByteArray>_> *)in_stack_ffffffffffffff80);
  qVar3 = QDataStream::readQSizeType((QDataStream *)in_stack_ffffffffffffff80);
  if (qVar3 < 0) {
    QDataStream::setStatus((Status)in_RDI);
    local_50 = in_RDI;
  }
  else {
    QList<std::pair<QByteArray,_QByteArray>_>::reserve
              ((QList<std::pair<QByteArray,_QByteArray>_> *)in_RDI,asize);
    for (in_stack_ffffffffffffff80 = (pair<QByteArray,_QByteArray> *)0x0; local_50 = in_RDI,
        (long)in_stack_ffffffffffffff80 < qVar3;
        in_stack_ffffffffffffff80 =
             (pair<QByteArray,_QByteArray> *)((long)&(in_stack_ffffffffffffff80->first).d.d + 1)) {
      memset(&local_48,0,0x30);
      local_48 = 0xaaaaaaaaaaaaaaaa;
      local_40 = 0xaaaaaaaaaaaaaaaa;
      local_38 = 0xaaaaaaaaaaaaaaaa;
      local_30 = 0xaaaaaaaaaaaaaaaa;
      local_28 = 0xaaaaaaaaaaaaaaaa;
      local_20 = 0xaaaaaaaaaaaaaaaa;
      std::pair<QByteArray,_QByteArray>::pair<QByteArray,_QByteArray,_true>
                (in_stack_ffffffffffffff80);
      ::operator>>((QDataStream *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      SVar2 = QDataStream::status(in_RDI);
      if (SVar2 == Ok) {
        QList<std::pair<QByteArray,_QByteArray>_>::append
                  ((QList<std::pair<QByteArray,_QByteArray>_> *)in_stack_ffffffffffffff80,
                   in_stack_ffffffffffffff78);
      }
      else {
        QList<std::pair<QByteArray,_QByteArray>_>::clear
                  ((QList<std::pair<QByteArray,_QByteArray>_> *)in_stack_ffffffffffffff80);
      }
      std::pair<QByteArray,_QByteArray>::~pair(in_stack_ffffffffffffff80);
      local_50 = in_RDI;
      if (SVar2 != Ok) break;
    }
  }
  StreamStateSaver::~StreamStateSaver((StreamStateSaver *)in_stack_ffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_50;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}